

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

int __thiscall
btAlignedObjectArray<btPlane>::copy
          (btAlignedObjectArray<btPlane> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  btPlane *pbVar2;
  undefined8 uVar3;
  long lVar4;
  long in_RCX;
  int i;
  long lVar5;
  
  lVar4 = (long)(int)dst;
  lVar5 = lVar4 * 0x14;
  for (; lVar4 < (int)src; lVar4 = lVar4 + 1) {
    pbVar2 = this->m_data;
    *(undefined4 *)(in_RCX + 0x10 + lVar5) = *(undefined4 *)((long)(&pbVar2->normal + 1) + lVar5);
    puVar1 = (undefined8 *)((long)(pbVar2->normal).m_floats + lVar5);
    uVar3 = puVar1[1];
    *(undefined8 *)(in_RCX + lVar5) = *puVar1;
    ((undefined8 *)(in_RCX + lVar5))[1] = uVar3;
    lVar5 = lVar5 + 0x14;
  }
  return (int)lVar4;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}